

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_relation.cpp
# Opt level: O2

unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true> __thiscall
duckdb::QueryRelation::ParseStatement
          (QueryRelation *this,ClientContext *context,string *query,string *error)

{
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var1;
  ParserOptions options_p;
  reference pvVar2;
  pointer pSVar3;
  ParserException *this_00;
  Parser parser;
  ParserOptions local_38;
  
  ClientContext::GetParserOptions(&local_38,context);
  options_p.max_expression_depth = local_38.max_expression_depth;
  options_p.preserve_identifier_case = local_38.preserve_identifier_case;
  options_p.integer_division = local_38.integer_division;
  options_p._2_6_ = local_38._2_6_;
  options_p.extensions = local_38.extensions;
  Parser::Parser(&parser,options_p);
  Parser::ParseQuery(&parser,query);
  if ((long)parser.statements.
            super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)parser.statements.
            super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
             ::get<true>(&parser.statements,0);
    pSVar3 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->(pvVar2);
    if (pSVar3->type == SELECT_STATEMENT) {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
               ::get<true>(&parser.statements,0);
      _Var1._M_head_impl =
           (pvVar2->
           super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)._M_t.
           super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
           .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
      (pvVar2->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
      _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
      super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
      (this->super_Relation)._vptr_Relation = (_func_int **)_Var1._M_head_impl;
      ::std::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                 *)&parser);
      return (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)
             (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)
             this;
    }
    this_00 = (ParserException *)__cxa_allocate_exception(0x10);
    ParserException::ParserException(this_00,error);
  }
  else {
    this_00 = (ParserException *)__cxa_allocate_exception(0x10);
    ParserException::ParserException(this_00,error);
  }
  __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<SelectStatement> QueryRelation::ParseStatement(ClientContext &context, const string &query,
                                                          const string &error) {
	Parser parser(context.GetParserOptions());
	parser.ParseQuery(query);
	if (parser.statements.size() != 1) {
		throw ParserException(error);
	}
	if (parser.statements[0]->type != StatementType::SELECT_STATEMENT) {
		throw ParserException(error);
	}
	return unique_ptr_cast<SQLStatement, SelectStatement>(std::move(parser.statements[0]));
}